

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunmatrix_sparse.c
# Opt level: O2

int Matvec_SparseCSR(SUNMatrix A,N_Vector x,N_Vector y)

{
  void *pvVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  realtype *prVar6;
  realtype *prVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  int iVar12;
  
  pvVar1 = A->content;
  lVar2 = *(long *)((long)pvVar1 + 0x38);
  lVar3 = *(long *)((long)pvVar1 + 0x20);
  lVar4 = *(long *)((long)pvVar1 + 0x30);
  iVar12 = 1;
  if (lVar3 != 0 && (lVar4 != 0 && lVar2 != 0)) {
    prVar6 = N_VGetArrayPointer(x);
    prVar7 = N_VGetArrayPointer(y);
    iVar12 = 1;
    if (prVar6 != prVar7 && (prVar7 != (realtype *)0x0 && prVar6 != (realtype *)0x0)) {
      lVar9 = 0;
      lVar8 = *A->content;
      if (*A->content < 1) {
        lVar8 = lVar9;
      }
      for (; lVar8 != lVar9; lVar9 = lVar9 + 1) {
        prVar7[lVar9] = 0.0;
      }
      iVar12 = 0;
      lVar9 = 0;
      while (lVar10 = lVar9, lVar10 != lVar8) {
        lVar5 = *(long *)(lVar2 + 8 + lVar10 * 8);
        for (lVar11 = *(long *)(lVar2 + lVar10 * 8); lVar9 = lVar10 + 1, lVar11 < lVar5;
            lVar11 = lVar11 + 1) {
          prVar7[lVar10] =
               *(double *)(lVar3 + lVar11 * 8) * prVar6[*(long *)(lVar4 + lVar11 * 8)] +
               prVar7[lVar10];
        }
      }
    }
  }
  return iVar12;
}

Assistant:

int Matvec_SparseCSR(SUNMatrix A, N_Vector x, N_Vector y)
{
  sunindextype i, j;
  sunindextype *Ap, *Aj;
  realtype *Ax, *xd, *yd;

  /* access data from CSR structure (return if failure) */
  Ap = SM_INDEXPTRS_S(A);
  Aj = SM_INDEXVALS_S(A);
  Ax = SM_DATA_S(A);
  if ((Ap == NULL) || (Aj == NULL) || (Ax == NULL))
    return 1;

  /* access vector data (return if failure) */
  xd = N_VGetArrayPointer(x);
  yd = N_VGetArrayPointer(y);
  if ((xd == NULL) || (yd == NULL) || (xd == yd))
    return 1;

  /* initialize result */
  for (i=0; i<SM_ROWS_S(A); i++)
    yd[i] = 0.0;

  /* iterate through matrix rows */
  for (i=0; i<SM_ROWS_S(A); i++) {

    /* iterate along row of A, performing product */
    for (j=Ap[i]; j<Ap[i+1]; j++)
      yd[i] += Ax[j]*xd[Aj[j]];

  }

  return(0);
}